

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

void * cgltf_calloc(cgltf_options *options,size_t element_size,cgltf_size count)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  void *pvVar3;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = element_size;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = count;
  if (SUB168(auVar1 * auVar2,8) == 0) {
    pvVar3 = (*(options->memory).alloc)((options->memory).user_data,count * element_size);
    if (pvVar3 != (void *)0x0) {
      pvVar3 = memset(pvVar3,0,count * element_size);
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

static void* cgltf_calloc(cgltf_options* options, size_t element_size, cgltf_size count)
{
	if (SIZE_MAX / element_size < count)
	{
		return NULL;
	}
	void* result = options->memory.alloc(options->memory.user_data, element_size * count);
	if (!result)
	{
		return NULL;
	}
	memset(result, 0, element_size * count);
	return result;
}